

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threading-c.cpp
# Opt level: O2

duckdb_task_state duckdb_create_task_state(duckdb_database database)

{
  CAPITaskState *this;
  DuckDB *this_00;
  type db;
  
  if (database == (duckdb_database)0x0) {
    this = (CAPITaskState *)0x0;
  }
  else {
    this = (CAPITaskState *)operator_new(0x18);
    this_00 = duckdb::shared_ptr<duckdb::DuckDB,_true>::operator->
                        ((shared_ptr<duckdb::DuckDB,_true> *)database);
    db = duckdb::shared_ptr<duckdb::DatabaseInstance,_true>::operator*(&this_00->instance);
    CAPITaskState::CAPITaskState(this,db);
  }
  return this;
}

Assistant:

duckdb_task_state duckdb_create_task_state(duckdb_database database) {
	if (!database) {
		return nullptr;
	}
	auto wrapper = reinterpret_cast<DatabaseWrapper *>(database);
	auto state = new CAPITaskState(*wrapper->database->instance);
	return state;
}